

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrismaticJoint.cpp
# Opt level: O0

void __thiscall iDynTree::PrismaticJoint::PrismaticJoint(PrismaticJoint *this)

{
  Axis *this_00;
  PrismaticJoint *in_RDI;
  double in_stack_000000c8;
  PrismaticJoint *in_stack_000000d0;
  Position local_48 [24];
  Direction local_30 [2];
  
  MovableJointImpl<1U,_1U>::MovableJointImpl(&in_RDI->super_MovableJointImpl1);
  (in_RDI->super_MovableJointImpl1).super_IJoint._vptr_IJoint =
       (_func_int **)&PTR__PrismaticJoint_004fa420;
  in_RDI->link1 = LINK_INVALID_INDEX;
  in_RDI->link2 = LINK_INVALID_INDEX;
  iDynTree::Transform::Identity();
  this_00 = &in_RDI->translation_axis_wrt_link1;
  iDynTree::Direction::Direction(local_30,1.0,0.0,0.0);
  iDynTree::Position::Zero();
  iDynTree::Axis::Axis(this_00,local_30,local_48);
  iDynTree::Transform::Transform(&in_RDI->link1_X_link2);
  iDynTree::Transform::Transform(&in_RDI->link2_X_link1);
  SpatialMotionVector::SpatialMotionVector((SpatialMotionVector *)0x466c8c);
  SpatialMotionVector::SpatialMotionVector((SpatialMotionVector *)0x466c9f);
  (*(in_RDI->super_MovableJointImpl1).super_IJoint._vptr_IJoint[0x15])(in_RDI,0);
  (*(in_RDI->super_MovableJointImpl1).super_IJoint._vptr_IJoint[0x17])(in_RDI,0);
  resetAxisBuffers(in_stack_000000d0);
  resetBuffers(in_stack_000000d0,in_stack_000000c8);
  disablePosLimits(in_RDI);
  resetJointDynamics(in_RDI);
  return;
}

Assistant:

PrismaticJoint::PrismaticJoint():
        link1(LINK_INVALID_INDEX), link2(LINK_INVALID_INDEX), link1_X_link2_at_rest(Transform::Identity()),
        translation_axis_wrt_link1(Axis(Direction(1.0, 0.0, 0.0), Position::Zero()))
{
    this->setPosCoordsOffset(0);
    this->setDOFsOffset(0);

    this->resetAxisBuffers();
    this->resetBuffers(0);
    this->disablePosLimits();
    this->resetJointDynamics();
}